

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
btTriangleMeshShape::getAabb
          (btTriangleMeshShape *this,btTransform *trans,btVector3 *aabbMin,btVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar10 = (this->m_localAabbMax).m_floats[0];
  fVar1 = (this->m_localAabbMin).m_floats[0];
  fVar2 = (this->m_localAabbMax).m_floats[1];
  fVar9 = (this->m_localAabbMin).m_floats[1];
  fVar3 = (this->m_localAabbMax).m_floats[2];
  fVar4 = (this->m_localAabbMin).m_floats[2];
  (*(this->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(this->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  fVar17 = extraout_XMM0_Da + (fVar10 - fVar1) * 0.5;
  fVar18 = extraout_XMM0_Da_00 + (fVar2 - fVar9) * 0.5;
  fVar8 = extraout_XMM0_Da_01 + (fVar3 - fVar4) * 0.5;
  fVar12 = ((this->m_localAabbMax).m_floats[0] + (this->m_localAabbMin).m_floats[0]) * 0.5;
  fVar16 = ((this->m_localAabbMax).m_floats[1] + (this->m_localAabbMin).m_floats[1]) * 0.5;
  fVar15 = ((this->m_localAabbMax).m_floats[2] + (this->m_localAabbMin).m_floats[2]) * 0.5;
  fVar9 = (trans->m_basis).m_el[0].m_floats[0];
  fVar3 = (trans->m_basis).m_el[0].m_floats[1];
  fVar4 = (trans->m_basis).m_el[0].m_floats[2];
  fVar10 = (trans->m_basis).m_el[2].m_floats[0];
  fVar1 = (trans->m_basis).m_el[2].m_floats[1];
  fVar2 = (trans->m_basis).m_el[2].m_floats[2];
  fVar14 = fVar15 * fVar2 + fVar12 * fVar10 + fVar16 * fVar1 + (trans->m_origin).m_floats[2];
  fVar11 = ABS(fVar2) * fVar8 + ABS(fVar10) * fVar17 + ABS(fVar1) * fVar18;
  fVar10 = (trans->m_basis).m_el[1].m_floats[0];
  fVar1 = (trans->m_basis).m_el[1].m_floats[1];
  fVar2 = (trans->m_basis).m_el[1].m_floats[2];
  uVar5 = *(undefined8 *)(trans->m_origin).m_floats;
  fVar13 = (float)uVar5 + fVar15 * fVar4 + fVar12 * fVar9 + fVar16 * fVar3;
  fVar12 = (float)((ulong)uVar5 >> 0x20) + fVar15 * fVar2 + fVar12 * fVar10 + fVar16 * fVar1;
  fVar9 = fVar8 * ABS(fVar4) + fVar17 * ABS(fVar9) + fVar18 * ABS(fVar3);
  fVar10 = fVar8 * ABS(fVar2) + fVar17 * ABS(fVar10) + fVar18 * ABS(fVar1);
  auVar7._4_4_ = fVar12 - fVar10;
  auVar7._0_4_ = fVar13 - fVar9;
  auVar7._8_4_ = fVar14 - fVar11;
  auVar7._12_4_ = 0;
  *(undefined1 (*) [16])aabbMin->m_floats = auVar7;
  auVar6._4_4_ = fVar10 + fVar12;
  auVar6._0_4_ = fVar9 + fVar13;
  auVar6._8_4_ = fVar11 + fVar14;
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar6;
  return;
}

Assistant:

void btTriangleMeshShape::getAabb(const btTransform& trans,btVector3& aabbMin,btVector3& aabbMax) const
{

	btVector3 localHalfExtents = btScalar(0.5)*(m_localAabbMax-m_localAabbMin);
	localHalfExtents += btVector3(getMargin(),getMargin(),getMargin());
	btVector3 localCenter = btScalar(0.5)*(m_localAabbMax+m_localAabbMin);
	
	btMatrix3x3 abs_b = trans.getBasis().absolute();  

	btVector3 center = trans(localCenter);

    btVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMin = center - extent;
	aabbMax = center + extent;
}